

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator this_01;
  pointer pEVar2;
  linked_ptr<testing::internal::ExpectationBase> *plVar3;
  ExpectationSet *in_RDI;
  const_iterator it;
  
  MutexBase::AssertHeld((MutexBase *)it._M_node);
  this_00 = ExpectationSet::begin(in_RDI);
  while( true ) {
    this_01 = ExpectationSet::end(in_RDI);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) {
      return true;
    }
    pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                       ((_Rb_tree_const_iterator<testing::Expectation> *)0x1277e1);
    plVar3 = Expectation::expectation_base(pEVar2);
    linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
    bVar1 = IsSatisfied((ExpectationBase *)this_01._M_node);
    if (!bVar1) break;
    pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                       ((_Rb_tree_const_iterator<testing::Expectation> *)0x127809);
    plVar3 = Expectation::expectation_base(pEVar2);
    linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
    bVar1 = AllPrerequisitesAreSatisfied((ExpectationBase *)this_00._M_node);
    if (!bVar1) {
      return false;
    }
    std::_Rb_tree_const_iterator<testing::Expectation>::operator++
              ((_Rb_tree_const_iterator<testing::Expectation> *)this_01._M_node);
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (!(it->expectation_base()->IsSatisfied()) ||
        !(it->expectation_base()->AllPrerequisitesAreSatisfied()))
      return false;
  }
  return true;
}